

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O2

void file_handle_reader_ops(FileHandlePool *fhp,int tracker)

{
  fdb_kvs_handle *handle;
  void *ptr;
  int index;
  fdb_status fVar1;
  int iVar2;
  ts_nsec tVar3;
  ts_nsec tVar4;
  uint64_t uVar5;
  size_t sVar6;
  ulong uVar7;
  fdb_kvs_handle *snap_handle;
  void *value;
  size_t valuelen;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_file_info info;
  char bodybuf [256];
  char keybuf [256];
  
  dbfile = (fdb_file_handle *)0x0;
  db = (fdb_kvs_handle *)0x0;
  snap_handle = (fdb_kvs_handle *)0x0;
  index = FileHandlePool::getAvailableResource(fhp,&dbfile,&db);
  tVar3 = get_monotonic_ts();
  fVar1 = fdb_snapshot_open(db,&snap_handle,0xffffffffffffffff);
  tVar4 = get_monotonic_ts();
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fdb_assert_die("status == FDB_RESULT_SUCCESS",
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                   ,0x1a5,(long)fVar1,0);
  }
  uVar5 = ts_diff(tVar3,tVar4);
  FileHandlePool::collectStat(fhp,3,uVar5);
  if (tracker % 100 == 0) {
    keybuf[0] = '\0';
    keybuf[1] = '\0';
    keybuf[2] = '\0';
    keybuf[3] = '\0';
    keybuf[4] = '\0';
    keybuf[5] = '\0';
    keybuf[6] = '\0';
    keybuf[7] = '\0';
    bodybuf[0] = '\0';
    bodybuf[1] = '\0';
    bodybuf[2] = '\0';
    bodybuf[3] = '\0';
    bodybuf[4] = '\0';
    bodybuf[5] = '\0';
    bodybuf[6] = '\0';
    bodybuf[7] = '\0';
    tVar3 = get_monotonic_ts();
    fVar1 = fdb_iterator_init(snap_handle,(fdb_iterator **)keybuf,(void *)0x0,0,(void *)0x0,0,0);
    tVar4 = get_monotonic_ts();
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fdb_assert_die("status == FDB_RESULT_SUCCESS",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                     ,0x1b5,(long)fVar1,0);
    }
    uVar5 = ts_diff(tVar3,tVar4);
    FileHandlePool::collectStat(fhp,5,uVar5);
    tVar3 = get_monotonic_ts();
    fVar1 = fdb_iterator_get((fdb_iterator *)keybuf._0_8_,(fdb_doc **)bodybuf);
    tVar4 = get_monotonic_ts();
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) {
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_doc_free((fdb_doc *)bodybuf._0_8_);
        uVar5 = ts_diff(tVar3,tVar4);
        FileHandlePool::collectStat(fhp,7,uVar5);
      }
      else {
        fdb_assert_die("status == FDB_RESULT_ITERATOR_FAIL",
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                       ,0x1c3,(long)fVar1,0xfffffffffffffff4);
      }
    }
    tVar3 = get_monotonic_ts();
    fVar1 = fdb_iterator_close((fdb_iterator *)keybuf._0_8_);
    tVar4 = get_monotonic_ts();
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fdb_assert_die("status == FDB_RESULT_SUCCESS",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                     ,0x1ca,(long)fVar1,0);
    }
    uVar5 = ts_diff(tVar3,tVar4);
    iVar2 = 8;
  }
  else {
    value = (void *)0x0;
    fVar1 = fdb_get_file_info(dbfile,&info);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fdb_assert_die("status == FDB_RESULT_SUCCESS",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                     ,0x1d5,(long)fVar1,0);
    }
    if (info.doc_count == 0) {
      uVar7 = 0;
    }
    else {
      iVar2 = rand();
      uVar7 = (ulong)(long)iVar2 % info.doc_count;
    }
    sprintf(keybuf,"key%d",uVar7 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar7 & 0xffffffff);
    tVar3 = get_monotonic_ts();
    handle = snap_handle;
    sVar6 = strlen(keybuf);
    fVar1 = fdb_get_kv(handle,keybuf,sVar6 + 1,&value,&valuelen);
    tVar4 = get_monotonic_ts();
    ptr = value;
    if (fVar1 == FDB_RESULT_KEY_NOT_FOUND) goto LAB_00104c2b;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fdb_assert_die("status == FDB_RESULT_KEY_NOT_FOUND",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                     ,0x1e5,(long)fVar1,0xfffffffffffffff7);
      goto LAB_00104c2b;
    }
    iVar2 = bcmp(value,bodybuf,valuelen);
    if (iVar2 != 0) {
      __assert_fail("memcmp(value, bodybuf, valuelen) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                    ,0x1e0,"void file_handle_reader_ops(FileHandlePool *, int)");
    }
    fdb_free_block(ptr);
    uVar5 = ts_diff(tVar3,tVar4);
    iVar2 = 2;
  }
  FileHandlePool::collectStat(fhp,iVar2,uVar5);
LAB_00104c2b:
  fVar1 = fdb_kvs_close(snap_handle);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fdb_assert_die("status == FDB_RESULT_SUCCESS",
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                   ,0x1eb,(long)fVar1,0);
  }
  FileHandlePool::returnResourceToPool(fhp,index);
  return;
}

Assistant:

void file_handle_reader_ops(FileHandlePool *fhp, int tracker) {
    fdb_status status;

    // Acquire handles from pool
    fdb_file_handle *dbfile = nullptr;
    fdb_kvs_handle *db = nullptr;
    fdb_kvs_handle *snap_handle = nullptr;
    const int index = fhp->getAvailableResource(&dbfile, &db);

    // Create an in-memory snapshot
    ts_nsec beginSnap = get_monotonic_ts();
    status = fdb_snapshot_open(db, &snap_handle, FDB_SNAPSHOT_INMEM);
    ts_nsec endSnap = get_monotonic_ts();
    fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);

    fhp->collectStat(IN_MEM_SNAP, ts_diff(beginSnap, endSnap));

    // Iterator ops using the snapshot handle once every 100 times
    if (tracker % 100 == 0) {
        fdb_iterator *iterator = nullptr;
        fdb_doc *rdoc = nullptr;
        ts_nsec begin, end;

        // Initialize iterator
        begin = get_monotonic_ts();
        status = fdb_iterator_init(snap_handle, &iterator,
                                   nullptr, 0, nullptr, 0,
                                   FDB_ITR_NONE);
        end = get_monotonic_ts();
        fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);

        fhp->collectStat(ITR_INIT, ts_diff(begin, end));

        // Get using iterator
        begin = get_monotonic_ts();
        status = fdb_iterator_get(iterator, &rdoc);
        end = get_monotonic_ts();
        if (status == FDB_RESULT_SUCCESS) {
            fdb_doc_free(rdoc);
            fhp->collectStat(ITR_GET, ts_diff(begin, end));
        } else {
            // Block not found, no keys available
            fdb_assert(status == FDB_RESULT_ITERATOR_FAIL,
                       status, FDB_RESULT_ITERATOR_FAIL);
        }

        // Close iterator
        begin = get_monotonic_ts();
        status = fdb_iterator_close(iterator);
        end = get_monotonic_ts();
        fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);

        fhp->collectStat(ITR_CLOSE, ts_diff(begin, end));
    } else {
        // Try fetching a random doc, using the snapshot handle
        void *value = nullptr;
        size_t valuelen;
        char keybuf[256], bodybuf[256];

        fdb_file_info info;
        status = fdb_get_file_info(dbfile, &info);
        fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);
        int i = (info.doc_count > 0) ? rand() % info.doc_count : 0;

        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        ts_nsec beginGet = get_monotonic_ts();
        status = fdb_get_kv(snap_handle,
                            (void*)keybuf, strlen(keybuf) + 1,
                            &value, &valuelen);
        ts_nsec endGet = get_monotonic_ts();
        if (status == FDB_RESULT_SUCCESS) {
            assert(memcmp(value, bodybuf, valuelen) == 0);
            fdb_free_block(value);
            fhp->collectStat(GET, ts_diff(beginGet, endGet));
        } else { // If doc_count is zero
            fdb_assert(status == FDB_RESULT_KEY_NOT_FOUND,
                       status, FDB_RESULT_KEY_NOT_FOUND);
        }
    }

    // Close snapshot handle
    status = fdb_kvs_close(snap_handle);
    fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);

    // Return resource to pool
    fhp->returnResourceToPool(index);
}